

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

int amqpvalue_get_uuid(AMQP_VALUE value,uuid *uuid_value)

{
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  AMQP_VALUE_DATA *value_data;
  
  if (value == (AMQP_VALUE)0x0 || uuid_value == (uuid *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x3b4;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_uuid",0x3b3,1,"Bad arguments: value = %p, uuid_value = %p",value,
                uuid_value);
    }
  }
  else if (value->type == AMQP_TYPE_UUID) {
    pAVar1 = (value->value).described_value.value;
    *(AMQP_VALUE *)*uuid_value = (value->value).described_value.descriptor;
    *(AMQP_VALUE *)(*uuid_value + 8) = pAVar1;
    iVar3 = 0;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x3bd;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_uuid",0x3bc,1,"Value is not of type UUID");
    }
  }
  return iVar3;
}

Assistant:

int amqpvalue_get_uuid(AMQP_VALUE value, uuid* uuid_value)
{
    int result;

    /* Codes_SRS_AMQPVALUE_01_117: [If any of the arguments is NULL then amqpvalue_get_uuid shall return a non-zero value.] */
    if ((value == NULL) ||
        (uuid_value == NULL))
    {
        LogError("Bad arguments: value = %p, uuid_value = %p",
            value, uuid_value);
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        /* Codes_SRS_AMQPVALUE_01_118: [If the type of the value is not uuid (was not created with amqpvalue_create_uuid), then amqpvalue_get_uuid shall return a non-zero value.] */
        if (value_data->type != AMQP_TYPE_UUID)
        {
            LogError("Value is not of type UUID");
            result = MU_FAILURE;
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_115: [amqpvalue_get_uuid shall fill in the uuid_value argument the uuid value stored by the AMQP value indicated by the value argument.] */
            (void)memcpy(*uuid_value, value_data->value.uuid_value, 16);

            /* Codes_SRS_AMQPVALUE_01_116: [On success amqpvalue_get_uuid shall return 0.] */
            result = 0;
        }
    }

    return result;
}